

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O2

void __thiscall
front::irGenerator::irGenerator::ir_finish_param_declare
          (irGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paramsName)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
  *this_00;
  uint32_t id;
  mapped_type mVar1;
  element_type *peVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  reference __k;
  uint32_t id_00;
  ulong __n;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *this_01;
  Variable saveVar;
  string local_c8;
  string local_a8;
  __shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2> local_88;
  Variable local_78;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  this_01 = &(this->_package).functions;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
           ::at(this_01,(this->_funcStack).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
  peVar2 = (pmVar3->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = &this->_funcNameToFuncData;
  __n = 0;
  while (__n < (ulong)((long)(peVar2->params).
                             super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar2->params).
                             super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
             ::at(this_01,(this->_funcStack).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1);
    id_00 = (uint32_t)(__n + 1);
    local_78.super_Displayable._vptr_Displayable._0_4_ = id_00;
    pmVar4 = std::
             map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
             ::at(&pmVar3->variables,(key_type_conflict *)&local_78);
    std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,
               &(pmVar4->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>);
    mir::inst::Variable::Variable
              (&local_78,(SharedTyPtr *)&local_88,pmVar4->is_memory_var,pmVar4->is_temp_var,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    getGenSaveParamVarName_abi_cxx11_(&local_a8,this,id_00);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
             ::operator[](this_00,(this->_funcStack).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -1);
    id = pmVar5->_nowLocalValueId;
    pmVar5->_nowLocalValueId = id + 1;
    insertLocalValue(this,&local_a8,id,&local_78);
    std::__cxx11::string::~string((string *)&local_a8);
    getGenSaveParamVarName_abi_cxx11_(&local_c8,this,id_00);
    std::variant<int,std::__cxx11::string>::
    variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
              ((variant<int,std::__cxx11::string> *)&local_58,&local_c8);
    ir_assign(this,(LeftVal *)&local_58,id_00);
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Variant_storage(&local_58);
    std::__cxx11::string::~string((string *)&local_c8);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
             ::operator[](this_00,(this->_funcStack).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -1);
    getGenSaveParamVarName_abi_cxx11_(&local_c8,this,id_00);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&pmVar5->_localValueNameToId,&local_c8);
    mVar1 = *pmVar6;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_front::irGenerator::FunctionData>_>_>
             ::operator[](this_00,(this->_funcStack).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -1);
    __k = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::at(paramsName,__n);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&pmVar5->_localValueNameToId,__k);
    *pmVar6 = mVar1;
    std::__cxx11::string::~string((string *)&local_c8);
    mir::inst::Variable::~Variable(&local_78);
    __n = __n + 1;
  }
  return;
}

Assistant:

void irGenerator::ir_finish_param_declare(std::vector<string> &paramsName) {
  std::vector<SharedTyPtr> &params =
      _package.functions.at(_funcStack.back()).type->params;

  for (int i = 0; i < params.size(); i++) {
    Variable &variable =
        _package.functions.at(_funcStack.back()).variables.at(i + 1);
    Variable saveVar(variable.ty, variable.is_memory_var, variable.is_temp_var);
    insertLocalValue(getGenSaveParamVarName(i + 1),
                     _funcNameToFuncData[_funcStack.back()]._nowLocalValueId++,
                     saveVar);
    ir_assign(getGenSaveParamVarName(i + 1), i + 1);
    _funcNameToFuncData[_funcStack.back()]
        ._localValueNameToId[paramsName.at(i)] =
        _funcNameToFuncData[_funcStack.back()]
            ._localValueNameToId[getGenSaveParamVarName(i + 1)];
  }
}